

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::ProcessNetwork
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  pointer pcVar3;
  string *psVar4;
  undefined1 auVar5 [8];
  Status SVar6;
  int iVar7;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  reference this_00;
  char *pcVar10;
  undefined1 *puVar11;
  _Alloc_hider _Var12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  undefined1 *puVar13;
  bool bVar14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string nwkData;
  Network nwk;
  StringArray aliases;
  CommissionerAppPtr commissioner;
  vector<unsigned_long,_std::allocator<unsigned_long>_> xpans;
  StringArray unresolved;
  json json;
  string local_438;
  undefined1 local_418 [8];
  _Alloc_hider local_410;
  undefined1 local_408 [24];
  _Alloc_hider local_3f0;
  size_type local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  undefined1 local_3c8 [8];
  _Alloc_hider local_3c0;
  char local_3b8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  _Alloc_hider local_3a0;
  size_type local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390 [2];
  string *local_368;
  string *local_360;
  string local_358;
  CommissionerAppPtr local_338;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_328;
  StringArray local_308;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2e8;
  undefined1 local_2d8 [8];
  json_value local_2d0;
  undefined4 local_2c8;
  undefined1 *local_2c0;
  long local_2b8;
  undefined1 local_2b0 [16];
  undefined4 local_2a0;
  undefined1 *local_298;
  long local_290;
  undefined1 local_288 [16];
  undefined4 local_278;
  undefined1 *local_270;
  long local_268;
  undefined1 local_260 [16];
  undefined4 local_250;
  undefined1 *local_248;
  long local_240;
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined1 *local_220;
  long local_218;
  undefined1 local_210 [16];
  undefined4 local_200;
  undefined1 *local_1f8;
  long local_1f0;
  undefined1 local_1e8 [16];
  undefined4 local_1d8;
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  undefined4 local_1b0;
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  undefined4 local_188;
  undefined1 *local_180;
  long local_178;
  undefined1 local_170 [16];
  undefined4 local_160;
  undefined1 *local_158;
  long local_150;
  undefined1 local_148 [16];
  undefined4 local_138;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  string local_110;
  undefined4 local_f0 [2];
  long local_e8;
  long local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  Error local_c8;
  undefined4 local_a0 [2];
  long local_98;
  long local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  Error local_78;
  string_t local_50;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  local_368 = (string *)&(__return_storage_ptr__->mError).mMessage;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  local_360 = (string *)&__return_storage_ptr__->mData;
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_338.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_338.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
    local_418 = (undefined1  [8])((ulong)local_418 & 0xffffffff00000000);
    local_410._M_p = "too few arguments";
    local_408._0_8_ = (pointer)0x11;
    local_408._8_8_ = 0;
    local_3f0._M_p = (pointer)0x0;
    pcVar10 = "too few arguments";
    local_408._16_8_ = (format_string_checker<char> *)local_418;
    do {
      pcVar8 = pcVar10 + 1;
      if (*pcVar10 == '}') {
        if ((pcVar8 == "") || (*pcVar8 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar8 = pcVar10 + 2;
      }
      else if (*pcVar10 == '{') {
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar10,"",(format_string_checker<char> *)local_418);
      }
      pcVar10 = pcVar8;
    } while (pcVar8 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_418;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_438,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_138 = 2;
    local_130 = local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_438._M_dataplus._M_p,
               local_438._M_dataplus._M_p + local_438._M_string_length);
    local_3c8._0_4_ = local_138;
    local_3c0._M_p = (pointer)&local_3b0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_3c0,local_130,local_130 + local_128);
    local_398 = 0;
    local_390[0]._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_3c8._0_4_;
    local_3a0._M_p = (pointer)local_390;
    std::__cxx11::string::operator=(local_368,(string *)&local_3c0);
    std::__cxx11::string::operator=(local_360,(string *)&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_p != local_390) {
      operator_delete(local_3a0._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_p != &local_3b0) {
      operator_delete(local_3c0._M_p);
    }
    if (local_130 != local_120) {
      operator_delete(local_130);
    }
    paVar9 = &local_438.field_2;
    goto LAB_0023abfd;
  }
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"save","");
  utils::ToLower((string *)local_3c8,pbVar2 + 1);
  utils::ToLower((string *)local_418,&local_438);
  auVar5 = local_418;
  if (local_3c0._M_p == local_410._M_p) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar14 = true;
    }
    else {
      iVar7 = bcmp((void *)local_3c8,(void *)local_418,(size_t)local_3c0._M_p);
      bVar14 = iVar7 == 0;
    }
  }
  else {
    bVar14 = false;
  }
  if (auVar5 != (undefined1  [8])local_408) {
    operator_delete((void *)auVar5);
  }
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p);
  }
  if (bVar14) {
    if (0x40 < (ulong)((long)(aExpr->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(aExpr->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      JobManager::GetSelectedCommissioner
                (&local_78,
                 (this->mJobManager).
                 super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,&local_338);
      local_3c8._0_4_ = local_78.mCode;
      local_3c0._M_p = (pointer)&local_3b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3c0,local_78.mMessage._M_dataplus._M_p,
                 local_78.mMessage._M_dataplus._M_p + local_78.mMessage._M_string_length);
      local_398 = 0;
      local_390[0]._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_3c8._0_4_;
      local_3a0._M_p = (pointer)local_390;
      std::__cxx11::string::operator=(local_368,(string *)&local_3c0);
      std::__cxx11::string::operator=(local_360,(string *)&local_3a0);
      EVar1 = (__return_storage_ptr__->mError).mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_p != local_390) {
        operator_delete(local_3a0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_p != &local_3b0) {
        operator_delete(local_3c0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.mMessage._M_dataplus._M_p != &local_78.mMessage.field_2) {
        operator_delete(local_78.mMessage._M_dataplus._M_p);
      }
      if (EVar1 != kNone) goto LAB_0023ac0b;
      (*((local_338.
          super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_CommissionerHandler)._vptr_CommissionerHandler[0x10])
                (local_a0,local_338.
                          super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 2);
      local_3c8._0_4_ = local_a0[0];
      local_3c0._M_p = (pointer)&local_3b0;
      std::__cxx11::string::_M_construct<char*>((string *)&local_3c0,local_98,local_90 + local_98);
      local_398 = 0;
      local_390[0]._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_3c8._0_4_;
      local_3a0._M_p = (pointer)local_390;
      std::__cxx11::string::operator=(local_368,(string *)&local_3c0);
      std::__cxx11::string::operator=(local_360,(string *)&local_3a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_p != local_390) {
        operator_delete(local_3a0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_p != &local_3b0) {
        operator_delete(local_3c0._M_p);
      }
      paVar9 = &local_88;
      goto LAB_0023abfd;
    }
    local_418 = (undefined1  [8])((ulong)local_418 & 0xffffffff00000000);
    local_410._M_p = "too few arguments";
    local_408._0_8_ = (pointer)0x11;
    local_408._8_8_ = 0;
    local_3f0._M_p = (pointer)0x0;
    pcVar10 = "too few arguments";
    local_408._16_8_ = (format_string_checker<char> *)local_418;
    do {
      pcVar8 = pcVar10 + 1;
      if (*pcVar10 == '}') {
        if ((pcVar8 == "") || (*pcVar8 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar8 = pcVar10 + 2;
      }
      else if (*pcVar10 == '{') {
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar10,"",(format_string_checker<char> *)local_418);
      }
      pcVar10 = pcVar8;
    } while (pcVar8 != "");
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_418;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_438,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_00);
    local_2c8 = 2;
    local_2c0 = local_2b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c0,local_438._M_dataplus._M_p,
               local_438._M_dataplus._M_p + local_438._M_string_length);
    local_3c8._0_4_ = local_2c8;
    local_3c0._M_p = (pointer)&local_3b0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_3c0,local_2c0,local_2c0 + local_2b8);
    local_398 = 0;
    local_390[0]._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_3c8._0_4_;
    local_3a0._M_p = (pointer)local_390;
    std::__cxx11::string::operator=(local_368,(string *)&local_3c0);
    std::__cxx11::string::operator=(local_360,(string *)&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_p != local_390) {
      operator_delete(local_3a0._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_p != &local_3b0) {
      operator_delete(local_3c0._M_p);
    }
    if (local_2c0 != local_2b0) {
      operator_delete(local_2c0);
    }
    _Var12._M_p = local_438._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p == &local_438.field_2) goto LAB_0023ac0b;
  }
  else {
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"sync","");
    utils::ToLower((string *)local_3c8,pbVar2 + 1);
    utils::ToLower((string *)local_418,&local_438);
    auVar5 = local_418;
    if (local_3c0._M_p == local_410._M_p) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar14 = true;
      }
      else {
        iVar7 = bcmp((void *)local_3c8,(void *)local_418,(size_t)local_3c0._M_p);
        bVar14 = iVar7 == 0;
      }
    }
    else {
      bVar14 = false;
    }
    if (auVar5 != (undefined1  [8])local_408) {
      operator_delete((void *)auVar5);
    }
    if (local_3c8 != (undefined1  [8])local_3b8) {
      operator_delete((void *)local_3c8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p);
    }
    if (bVar14) {
      JobManager::GetSelectedCommissioner
                (&local_c8,
                 (this->mJobManager).
                 super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,&local_338);
      local_3c8._0_4_ = local_c8.mCode;
      local_3c0._M_p = (pointer)&local_3b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3c0,local_c8.mMessage._M_dataplus._M_p,
                 local_c8.mMessage._M_dataplus._M_p + local_c8.mMessage._M_string_length);
      local_398 = 0;
      local_390[0]._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_3c8._0_4_;
      local_3a0._M_p = (pointer)local_390;
      std::__cxx11::string::operator=(local_368,(string *)&local_3c0);
      std::__cxx11::string::operator=(local_360,(string *)&local_3a0);
      EVar1 = (__return_storage_ptr__->mError).mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_p != local_390) {
        operator_delete(local_3a0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_p != &local_3b0) {
        operator_delete(local_3c0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.mMessage._M_dataplus._M_p != &local_c8.mMessage.field_2) {
        operator_delete(local_c8.mMessage._M_dataplus._M_p);
      }
      if (EVar1 != kNone) goto LAB_0023ac0b;
      (*((local_338.
          super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_CommissionerHandler)._vptr_CommissionerHandler[0x11])(local_f0);
      local_3c8._0_4_ = local_f0[0];
      local_3c0._M_p = (pointer)&local_3b0;
      std::__cxx11::string::_M_construct<char*>((string *)&local_3c0,local_e8,local_e0 + local_e8);
      local_398 = 0;
      local_390[0]._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_3c8._0_4_;
      local_3a0._M_p = (pointer)local_390;
      std::__cxx11::string::operator=(local_368,(string *)&local_3c0);
      std::__cxx11::string::operator=(local_360,(string *)&local_3a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_p != local_390) {
        operator_delete(local_3a0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_p != &local_3b0) {
        operator_delete(local_3c0._M_p);
      }
      paVar9 = &local_d8;
LAB_0023abfd:
      _Var12._M_p = (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               **)(paVar9->_M_local_buf + -0x10);
    }
    else {
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"list","");
      utils::ToLower((string *)local_3c8,pbVar2 + 1);
      utils::ToLower((string *)local_418,&local_438);
      auVar5 = local_418;
      if (local_3c0._M_p == local_410._M_p) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          bVar14 = true;
        }
        else {
          iVar7 = bcmp((void *)local_3c8,(void *)local_418,(size_t)local_3c0._M_p);
          bVar14 = iVar7 == 0;
        }
      }
      else {
        bVar14 = false;
      }
      if (auVar5 != (undefined1  [8])local_408) {
        operator_delete((void *)auVar5);
      }
      if (local_3c8 != (undefined1  [8])local_3b8) {
        operator_delete((void *)local_3c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p);
      }
      if (bVar14) {
        ProcessNetworkList((Value *)local_3c8,this,aExpr);
        (__return_storage_ptr__->mError).mCode = local_3c8._0_4_;
        std::__cxx11::string::operator=(local_368,(string *)&local_3c0);
        std::__cxx11::string::operator=(local_360,(string *)&local_3a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_p != local_390) {
          operator_delete(local_3a0._M_p);
        }
        paVar9 = &local_3b0;
        goto LAB_0023abfd;
      }
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"select","");
      utils::ToLower((string *)local_3c8,pbVar2 + 1);
      utils::ToLower((string *)local_418,&local_438);
      auVar5 = local_418;
      if (local_3c0._M_p == local_410._M_p) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          bVar14 = true;
        }
        else {
          iVar7 = bcmp((void *)local_3c8,(void *)local_418,(size_t)local_3c0._M_p);
          bVar14 = iVar7 == 0;
        }
      }
      else {
        bVar14 = false;
      }
      if (auVar5 != (undefined1  [8])local_408) {
        operator_delete((void *)auVar5);
      }
      if (local_3c8 != (undefined1  [8])local_3b8) {
        operator_delete((void *)local_3c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p);
      }
      if (bVar14) {
        local_2d8[0] = null;
        local_2d0.object = (object_t *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_2d8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_2d8);
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((long)(aExpr->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 == 0x60) {
          local_3c8 = (undefined1  [8])local_3b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"none","");
          bVar14 = CaseInsensitiveEqual(pbVar2 + 2,(string *)local_3c8);
          if (local_3c8 != (undefined1  [8])local_3b8) {
            operator_delete((void *)local_3c8);
          }
          if (bVar14) {
            SVar6 = persistent_storage::Registry::ForgetCurrentNetwork
                              ((this->mRegistry).
                               super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
            if (SVar6 != kSuccess) {
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              args_01.field_1.args_ = in_R9.args_;
              args_01.desc_ = (unsigned_long_long)&local_438;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)local_418,(v10 *)"network unselection failed",
                         (string_view)ZEXT816(0x1a),args_01);
              local_188 = 0x12;
              puVar13 = local_170;
              local_180 = puVar13;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_180,local_418,local_410._M_p + (long)local_418);
              local_3c8._0_4_ = local_188;
              local_3c0._M_p = (pointer)&local_3b0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3c0,local_180,local_180 + local_178);
              local_3a0._M_p = (pointer)local_390;
              local_398 = 0;
              local_390[0]._M_local_buf[0] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_3c8);
              Value::~Value((Value *)local_3c8);
              puVar11 = local_180;
              goto LAB_0023b654;
            }
LAB_0023be6d:
            UpdateNetworkSelectionInfo((Error *)local_3c8,this,false);
            paVar9 = &local_3b0;
            _Var12._M_p = local_3c0._M_p;
            goto LAB_0023be88;
          }
          pbVar2 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_3c8 = (undefined1  [8])local_3b8;
          pcVar3 = pbVar2[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3c8,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
          __l._M_len = 1;
          __l._M_array = (iterator)local_3c8;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_358,__l,(allocator_type *)local_418);
          if (local_3c8 != (undefined1  [8])local_3b8) {
            operator_delete((void *)local_3c8);
          }
          local_328.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_328.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (uint64_t *)0x0;
          local_328.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_308.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_308.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_308.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          SVar6 = persistent_storage::Registry::GetNetworkXpansByAliases
                            ((this->mRegistry).
                             super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,(StringArray *)&local_358,&local_328,&local_308);
          if (SVar6 == kSuccess) {
            if ((long)local_328.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_328.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start != 8) {
              ::fmt::v10::detail::
              check_format_string<unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                        ();
              local_418 = (undefined1  [8])
                          ((long)local_328.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_328.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3);
              pbVar2 = (aExpr->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_408._0_8_ = pbVar2[2]._M_dataplus._M_p;
              local_408._8_8_ = pbVar2[2]._M_string_length;
              args_09.field_1.values_ = in_R9.values_;
              args_09.desc_ = (unsigned_long_long)local_418;
              fmt_01.size_ = 0xd4;
              fmt_01.data_ = (char *)0x30;
              ::fmt::v10::vformat_abi_cxx11_
                        (&local_438,(v10 *)"Detected {} networks instead of 1 for alias \'{}\'",
                         fmt_01,args_09);
              local_1d8 = 0xb;
              local_1d0 = local_1c0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1d0,local_438._M_dataplus._M_p,
                         local_438._M_dataplus._M_p + local_438._M_string_length);
              local_3c8._0_4_ = local_1d8;
              local_3c0._M_p = (pointer)&local_3b0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3c0,local_1d0,local_1d0 + local_1c8);
              local_3a0._M_p = (pointer)local_390;
              local_398 = 0;
              local_390[0]._M_local_buf[0] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_3c8);
              Value::~Value((Value *)local_3c8);
              if (local_1d0 != local_1c0) {
                operator_delete(local_1d0);
              }
              paVar9 = &local_438.field_2;
              _Var12._M_p = local_438._M_dataplus._M_p;
              goto LAB_0023be2d;
            }
            SVar6 = persistent_storage::Registry::SetCurrentNetwork
                              ((this->mRegistry).
                               super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,*local_328.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
            if (SVar6 != kSuccess) {
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              args_07.field_1.values_ = in_R9.values_;
              args_07.desc_ = (unsigned_long_long)&local_438;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)local_418,(v10 *)"network selection failed",
                         (string_view)ZEXT816(0x18),args_07);
              local_200 = 0x12;
              puVar13 = local_1e8;
              local_1f8 = puVar13;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1f8,local_418,local_410._M_p + (long)local_418);
              local_3c8._0_4_ = local_200;
              local_3c0._M_p = (pointer)&local_3b0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3c0,local_1f8,local_1f8 + local_1f0);
              local_3a0._M_p = (pointer)local_390;
              local_398 = 0;
              local_390[0]._M_local_buf[0] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_3c8);
              Value::~Value((Value *)local_3c8);
              puVar11 = local_1f8;
              goto LAB_0023b7d5;
            }
            bVar14 = true;
          }
          else {
            ::fmt::v10::detail::
            check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                      ();
            pbVar2 = (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_438._M_dataplus._M_p = pbVar2[2]._M_dataplus._M_p;
            local_438._M_string_length = pbVar2[2]._M_string_length;
            args_03.field_1.values_ = in_R9.values_;
            args_03.desc_ = (unsigned_long_long)&local_438;
            fmt.size_ = 0xd;
            fmt.data_ = (char *)0x32;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_418,
                       (v10 *)"Failed to resolve extended PAN Id for network \'{}\'",fmt,args_03);
            local_1b0 = 0x12;
            puVar13 = local_198;
            local_1a8 = puVar13;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a8,local_418,local_410._M_p + (long)local_418);
            local_3c8._0_4_ = local_1b0;
            local_3c0._M_p = (pointer)&local_3b0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_3c0,local_1a8,local_1a8 + local_1a0);
            local_3a0._M_p = (pointer)local_390;
            local_398 = 0;
            local_390[0]._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_3c8);
            Value::~Value((Value *)local_3c8);
            puVar11 = local_1a8;
LAB_0023b7d5:
            if (puVar11 != puVar13) {
              operator_delete(puVar11);
            }
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_408;
            _Var12._M_p = (pointer)local_418;
LAB_0023be2d:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var12._M_p != paVar9) {
              operator_delete(_Var12._M_p);
            }
            bVar14 = false;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_308);
          if (local_328.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (uint64_t *)0x0) {
            operator_delete(local_328.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_358);
          if (bVar14) goto LAB_0023be6d;
        }
        else {
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_02.field_1.args_ = in_R9.args_;
          args_02.desc_ = (unsigned_long_long)&local_438;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_418,(v10 *)"too many arguments",(string_view)ZEXT816(0x12),
                     args_02);
          local_160 = 2;
          puVar13 = local_148;
          local_158 = puVar13;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,local_418,local_410._M_p + (long)local_418);
          local_3c8._0_4_ = local_160;
          local_3c0._M_p = (pointer)&local_3b0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3c0,local_158,local_158 + local_150);
          local_3a0._M_p = (pointer)local_390;
          local_398 = 0;
          local_390[0]._M_local_buf[0] = '\0';
          Value::operator=(__return_storage_ptr__,(Value *)local_3c8);
          Value::~Value((Value *)local_3c8);
          puVar11 = local_158;
LAB_0023b654:
          if (puVar11 != puVar13) {
            operator_delete(puVar11);
          }
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_408;
          _Var12._M_p = (pointer)local_418;
LAB_0023be88:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var12._M_p != paVar9) {
            operator_delete(_Var12._M_p);
          }
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_2d8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy
                  ((json_value *)
                   &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_2d8)->m_value,local_2d8[0]);
        goto LAB_0023ac0b;
      }
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"identify","");
      utils::ToLower((string *)local_3c8,pbVar2 + 1);
      utils::ToLower((string *)local_418,&local_438);
      auVar5 = local_418;
      if (local_3c0._M_p == local_410._M_p) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          bVar14 = true;
        }
        else {
          iVar7 = bcmp((void *)local_3c8,(void *)local_418,(size_t)local_3c0._M_p);
          bVar14 = iVar7 == 0;
        }
      }
      else {
        bVar14 = false;
      }
      if (auVar5 != (undefined1  [8])local_408) {
        operator_delete((void *)auVar5);
      }
      if (local_3c8 != (undefined1  [8])local_3b8) {
        operator_delete((void *)local_3c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p);
      }
      if (bVar14) {
        local_308.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)local_308.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
        local_308.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)&local_308);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)&local_308);
        persistent_storage::Network::Network((Network *)local_3c8);
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        local_438._M_string_length = 0;
        local_438.field_2._M_local_buf[0] = '\0';
        if ((long)(aExpr->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(aExpr->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start == 0x40) {
          SVar6 = persistent_storage::Registry::GetCurrentNetwork
                            ((this->mRegistry).
                             super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,(Network *)local_3c8);
          if (SVar6 != kSuccess) {
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_04.field_1.values_ = in_R9.values_;
            args_04.desc_ = (unsigned_long_long)&local_328;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_358,(v10 *)"getting current network failed",(string_view)ZEXT816(0x1e)
                       ,args_04);
            local_250 = 0x12;
            puVar13 = local_238;
            local_248 = puVar13;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_248,local_358._M_dataplus._M_p,
                       local_358._M_dataplus._M_p + local_358._M_string_length);
            local_418._0_4_ = local_250;
            local_410._M_p = local_408 + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_410,local_248,local_248 + local_240);
            local_3f0._M_p = (pointer)&local_3e0;
            local_3e8 = 0;
            local_3e0._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_418);
            Value::~Value((Value *)local_418);
            puVar11 = local_248;
            goto LAB_0023bb04;
          }
          if (local_3c8._0_4_ != ~kNone) {
            if (local_3c8._4_4_ != 0xffffffff) {
              SVar6 = persistent_storage::Registry::GetDomainNameByXpan
                                ((this->mRegistry).
                                 super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,(uint64_t)local_3a0._M_p,&local_438);
              if (SVar6 != kSuccess) {
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                args_08.field_1.values_ = in_R9.values_;
                args_08.desc_ = (unsigned_long_long)&local_328;
                ::fmt::v10::vformat_abi_cxx11_
                          (&local_358,(v10 *)"Failed to find registry entity of type: domain",
                           (string_view)ZEXT816(0x2e),args_08);
                local_278 = 5;
                puVar13 = local_260;
                local_270 = puVar13;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_270,local_358._M_dataplus._M_p,
                           local_358._M_dataplus._M_p + local_358._M_string_length);
                local_418._0_4_ = local_278;
                local_410._M_p = local_408 + 8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_410,local_270,local_270 + local_268);
                local_3f0._M_p = (pointer)&local_3e0;
                local_3e8 = 0;
                local_3e0._M_local_buf[0] = '\0';
                Value::operator=(__return_storage_ptr__,(Value *)local_418);
                Value::~Value((Value *)local_418);
                puVar11 = local_270;
                goto LAB_0023bb04;
              }
              std::__cxx11::string::push_back((char)&local_438);
            }
            std::__cxx11::string::_M_append((char *)&local_438,(ulong)local_3c0._M_p);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_2e8,&local_438);
            utils::Hex<unsigned_long>((string *)local_418,(unsigned_long)local_3a0._M_p);
            this_00 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                    *)&local_308,(key_type *)local_418);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator=(this_00,&local_2e8);
            if (local_418 != (undefined1  [8])local_408) {
              operator_delete((void *)local_418);
            }
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&local_2e8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::dump(&local_50,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&local_308,4,' ',false,strict);
            Value::Value((Value *)local_418,&local_50);
            Value::operator=(__return_storage_ptr__,(Value *)local_418);
            Value::~Value((Value *)local_418);
            psVar4 = &local_50;
            goto LAB_0023bb16;
          }
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"none","");
          Value::Value((Value *)local_418,&local_110);
          Value::operator=(__return_storage_ptr__,(Value *)local_418);
          Value::~Value((Value *)local_418);
          _Var12._M_p = local_110._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) goto LAB_0023bb1f;
        }
        else {
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_06.field_1.values_ = in_R9.values_;
          args_06.desc_ = (unsigned_long_long)&local_328;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_358,(v10 *)"too many arguments",(string_view)ZEXT816(0x12),args_06);
          local_228 = 2;
          puVar13 = local_210;
          local_220 = puVar13;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_220,local_358._M_dataplus._M_p,
                     local_358._M_dataplus._M_p + local_358._M_string_length);
          local_418._0_4_ = local_228;
          local_410._M_p = local_408 + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_410,local_220,local_220 + local_218);
          local_3f0._M_p = (pointer)&local_3e0;
          local_3e8 = 0;
          local_3e0._M_local_buf[0] = '\0';
          Value::operator=(__return_storage_ptr__,(Value *)local_418);
          Value::~Value((Value *)local_418);
          puVar11 = local_220;
LAB_0023bb04:
          if (puVar11 != puVar13) {
            operator_delete(puVar11);
          }
          psVar4 = &local_358;
LAB_0023bb16:
          _Var12._M_p = *(pointer *)((psVar4->field_2)._M_local_buf + -0x10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var12._M_p != &psVar4->field_2) {
LAB_0023bb1f:
            operator_delete(_Var12._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p);
        }
        persistent_storage::Network::~Network((Network *)local_3c8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)&local_308);
        goto LAB_0023ac0b;
      }
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_438._M_dataplus._M_p = pbVar2[1]._M_dataplus._M_p;
      local_438._M_string_length = pbVar2[1]._M_string_length;
      args_05.field_1.args_ = in_R9.args_;
      args_05.desc_ = (unsigned_long_long)&local_438;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x1f;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_418,(v10 *)"\'{}\' is not a valid sub-command",fmt_00,args_05);
      local_2a0 = 3;
      local_298 = local_288;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_418,local_410._M_p + (long)local_418);
      local_3c8._0_4_ = local_2a0;
      local_3c0._M_p = (pointer)&local_3b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3c0,local_298,local_298 + local_290);
      local_3a0._M_p = (pointer)local_390;
      local_398 = 0;
      local_390[0]._M_local_buf[0] = '\0';
      Value::operator=(__return_storage_ptr__,(Value *)local_3c8);
      Value::~Value((Value *)local_3c8);
      if (local_298 != local_288) {
        operator_delete(local_298);
      }
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_408;
      _Var12._M_p = (pointer)local_418;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var12._M_p == paVar9) goto LAB_0023ac0b;
  }
  operator_delete(_Var12._M_p);
LAB_0023ac0b:
  if (local_338.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_338.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessNetwork(const Expression &aExpr)
{
    using namespace ot::commissioner::persistent_storage;

    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "save"))
    {
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        SuccessOrExit(value = commissioner->SaveNetworkData(aExpr[2]));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "sync"))
    {
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        SuccessOrExit(value = commissioner->SyncNetworkData());
    }
    else if (CaseInsensitiveEqual(aExpr[1], "list"))
    {
        SuccessOrExit(value = ProcessNetworkList(aExpr));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "select"))
    {
        ::nlohmann::json json;

        VerifyOrExit(aExpr.size() == 3, value = ERROR_INVALID_ARGS(SYNTAX_MANY_ARGS));
        if (CaseInsensitiveEqual(aExpr[2], "none"))
        {
            RegistryStatus status = mRegistry->ForgetCurrentNetwork();
            VerifyOrExit(status == RegistryStatus::kSuccess,
                         value = ERROR_REGISTRY_ERROR("network unselection failed"));
        }
        else
        {
            StringArray           aliases = {aExpr[2]};
            std::vector<uint64_t> xpans;
            StringArray           unresolved;
            VerifyOrExit(mRegistry->GetNetworkXpansByAliases(aliases, xpans, unresolved) == RegistryStatus::kSuccess,
                         value = ERROR_REGISTRY_ERROR("Failed to resolve extended PAN Id for network '{}'", aExpr[2]));
            VerifyOrExit(xpans.size() == 1, value = ERROR_IO_ERROR("Detected {} networks instead of 1 for alias '{}'",
                                                                   xpans.size(), aExpr[2]));
            VerifyOrExit(mRegistry->SetCurrentNetwork(xpans[0]) == RegistryStatus::kSuccess,
                         value = ERROR_REGISTRY_ERROR("network selection failed"));
        }
        // update console prompt after network selection/deselection
        SuccessOrExit(UpdateNetworkSelectionInfo());
    }
    else if (CaseInsensitiveEqual(aExpr[1], "identify"))
    {
        ::nlohmann::json json;
        Network          nwk;
        std::string      nwkData;

        VerifyOrExit(aExpr.size() == 2, value = ERROR_INVALID_ARGS(SYNTAX_MANY_ARGS));
        VerifyOrExit(mRegistry->GetCurrentNetwork(nwk) == RegistryStatus::kSuccess,
                     value = ERROR_REGISTRY_ERROR(RUNTIME_CUR_NETWORK_FAILED));
        if (nwk.mId.mId == EMPTY_ID)
        {
            value = std::string("none");
        }
        else
        {
            if (nwk.mDomainId.mId != EMPTY_ID)
            {
                VerifyOrExit(mRegistry->GetDomainNameByXpan(nwk.mXpan, nwkData) == RegistryStatus::kSuccess,
                             value = ERROR_NOT_FOUND(NOT_FOUND_STR DOMAIN_STR));
                nwkData += '/';
            }
            nwkData += nwk.mName;
            json[utils::Hex(nwk.mXpan)] = nwkData;
            value                       = json.dump(JSON_INDENT_DEFAULT);
        }
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

exit:
    return value;
}